

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O0

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_single_char_Test<char>::Body
          (iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_single_char_Test<char> *this)

{
  char delim;
  bool bVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  AssertionHelper local_230;
  Fixed local_1f0;
  char *local_68;
  undefined1 local_60 [8];
  AssertionResult iutest_ar;
  undefined1 local_30 [8];
  basic_string_view<char,_std::char_traits<char>_> re;
  basic_string_view<char,_std::char_traits<char>_> s;
  iu_StringViewSplit_x_iutest_x_chain_at_last_front_by_single_char_Test<char> *this_local;
  
  pcVar2 = constant::cpp_type_data1<char>();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&re._M_str,pcVar2);
  delim = constant::colon<char>();
  iutest_ar._38_1_ = split<char,_nullptr>(delim);
  at_last();
  detail::split_at_last::front((split_at_last *)&iutest_ar.field_0x24);
  iutest_ar._39_1_ =
       detail::split_helper<char,_true,_false,_false>::
       operator>><detail::split_at_last_front,_nullptr>
                 ((split_helper<char,_true,_false,_false> *)&iutest_ar.field_0x26);
  _local_30 = detail::
              operator|<std::basic_string_view<char,_std::char_traits<char>_>,_char,_char,_nullptr>
                        ((basic_string_view<char,_std::char_traits<char>_> *)&re._M_str,
                         (split_helper_subroutine<detail::split_at_last_front,_char,_char> *)
                         &iutest_ar.field_0x27);
  iutest::detail::AlwaysZero();
  local_68 = constant::cpp_basic_istream<char>();
  iutest::internal::EqHelper<false>::
  Compare<char_const*,std::basic_string_view<char,std::char_traits<char>>>
            ((AssertionResult *)local_60,
             (EqHelper<false> *)"constant::cpp_basic_istream<char_type>()","re",(char *)&local_68,
             (char **)local_30,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    memset(&local_1f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_60);
    iutest::AssertionHelper::AssertionHelper
              (&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x95,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_230,&local_1f0);
    iutest::AssertionHelper::~AssertionHelper(&local_230);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_last_front_by_single_char)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::cpp_type_data1<char_type>();
	const auto re = s | split(constant::colon<char_type>()) >> at_last().front();
	IUTEST_ASSERT_EQ(constant::cpp_basic_istream<char_type>(), re);
}